

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular-array.h
# Opt level: O3

void __thiscall
wabt::CircularArray<wabt::Token,_2UL>::~CircularArray(CircularArray<wabt::Token,_2UL> *this)

{
  size_type sVar1;
  long lVar2;
  
  sVar1 = this->size_;
  while (sVar1 != 0) {
    pop_back(this);
    sVar1 = this->size_;
  }
  lVar2 = 0x50;
  do {
    Token::~Token((Token *)((long)&(this->contents_)._M_elems[0].loc.filename.data_ + lVar2));
    lVar2 = lVar2 + -0x50;
  } while (lVar2 != -0x50);
  return;
}

Assistant:

~CircularArray() { clear(); }